

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::bitmaskI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  long lVar2;
  Literal *in_RDX;
  Type *pTVar3;
  LaneArray<16> local_198;
  
  getLanes<signed_char,16>(&local_198,(wasm *)this,in_RDX);
  uVar1 = 0;
  pTVar3 = &local_198._M_elems[0].type;
  lVar2 = 0;
  do {
    if (pTVar3->id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    uVar1 = uVar1 | (((Literal *)(pTVar3 + -2))->field_0).i32 >> 0x1f & 1 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
    pTVar3 = pTVar3 + 3;
  } while (lVar2 != 0x10);
  (__return_storage_ptr__->field_0).i32 = uVar1;
  (__return_storage_ptr__->type).id = 2;
  lVar2 = 0x168;
  do {
    ~Literal((Literal *)((long)&local_198._M_elems[0].field_0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI8x16() const {
  return bitmask<16, &Literal::getLanesSI8x16>(*this);
}